

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modes.c
# Opt level: O2

int set_default_mode(int f,int n)

{
  maps_s *pmVar1;
  int iVar2;
  char *pcVar3;
  maps_s *pmVar4;
  maps_s **ppmVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  char local_48 [8];
  char modebuf [32];
  
  pcVar3 = eread("Set Default Mode: ",local_48,0x20,8);
  if (pcVar3 == (char *)0x0) {
    return 2;
  }
  if (*pcVar3 == '\0') {
    return 0;
  }
  pmVar4 = name_mode(local_48);
  if (pmVar4 == (maps_s *)0x0) {
    dobeep();
    ewprintf("can\'t find mode %s",local_48);
    return 0;
  }
  if ((f & 7U) == 0) {
    lVar6 = 0;
    ppmVar5 = defb_modes;
    do {
      if (defb_nmodes < lVar6) goto LAB_00113437;
      lVar6 = lVar6 + 1;
      pmVar1 = *ppmVar5;
      ppmVar5 = ppmVar5 + 1;
    } while (pmVar1 != pmVar4);
    n = 0;
  }
  else {
LAB_00113437:
    if (0 < n) {
      lVar6 = (long)defb_nmodes;
      lVar7 = 0;
      ppmVar5 = defb_modes;
      while (lVar7 <= lVar6) {
        lVar7 = lVar7 + 1;
        pmVar1 = *ppmVar5;
        ppmVar5 = ppmVar5 + 1;
        if (pmVar1 == pmVar4) {
          return 1;
        }
      }
      if (2 < defb_nmodes) {
        dobeep();
        ewprintf("Too many modes");
        return 0;
      }
      defb_nmodes = defb_nmodes + 1;
      defb_modes[lVar6 + 1] = pmVar4;
      goto LAB_00113529;
    }
  }
  uVar8 = 0;
  if (0 < defb_nmodes) {
    uVar8 = (ulong)(uint)defb_nmodes;
  }
  lVar6 = 1;
  while( true ) {
    if (lVar6 - uVar8 == 1) {
      return 1;
    }
    if (pmVar4 == defb_modes[lVar6]) break;
    lVar6 = lVar6 + 1;
  }
  for (; lVar6 < defb_nmodes; lVar6 = lVar6 + 1) {
    defb_modes[lVar6] = defb_modes[lVar6 + 1];
  }
  defb_nmodes = defb_nmodes + -1;
LAB_00113529:
  iVar2 = bcmp(local_48,"overwrite",10);
  if (iVar2 == 0) {
    defb_flag = (defb_flag & 0xfffffff7U) + (uint)(0 < n) * 8;
  }
  iVar2 = bcmp(local_48,"notab",6);
  if (iVar2 == 0) {
    if (n < 1) {
      defb_flag = defb_flag & 0xfffffffb;
    }
    else {
      defb_flag = defb_flag | 4;
    }
  }
  return 1;
}

Assistant:

int
set_default_mode(int f, int n)
{
	int	 i;
	struct maps_s	*m;
	char	 modebuf[32], *bufp;

	if ((bufp = eread("Set Default Mode: ", modebuf, sizeof(modebuf),
	    EFNEW)) == NULL)
		return (ABORT);
	else if (bufp[0] == '\0')
		return (FALSE);
	if ((m = name_mode(modebuf)) == NULL) {
		dobeep();
		ewprintf("can't find mode %s", modebuf);
		return (FALSE);
	}
	if (!(f & FFARG)) {
		for (i = 0; i <= defb_nmodes; i++)
			if (defb_modes[i] == m) {
				/* mode already set */
				n = 0;
				break;
			}
	}
	if (n > 0) {
		for (i = 0; i <= defb_nmodes; i++)
			if (defb_modes[i] == m)
				/* mode already set */
				return (TRUE);
		if (defb_nmodes >= PBMODES - 1) {
			dobeep();
			ewprintf("Too many modes");
			return (FALSE);
		}
		defb_modes[++defb_nmodes] = m;
	} else {
		/* fundamental is defb_modes[0] and can't be unset */
		for (i = 1; i <= defb_nmodes && m != defb_modes[i]; i++);
		if (i > defb_nmodes)
			/* mode was not set */
			return (TRUE);
		for (; i < defb_nmodes; i++)
			defb_modes[i] = defb_modes[i + 1];
		defb_nmodes--;
	}
	if (strcmp(modebuf, "overwrite") == 0) {
		if (n <= 0)
			defb_flag &= ~BFOVERWRITE;
		else
			defb_flag |= BFOVERWRITE;
	}
	if (strcmp(modebuf, "notab") == 0) {
		if (n <= 0)
			defb_flag &= ~BFNOTAB;
		else
			defb_flag |= BFNOTAB;
	}
	return (TRUE);
}